

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O0

void xor_buffered_decrement_counter
               (uint32_t index,uint64_t hash,xor_setbuffer_t *buffer,xor_xorset_t *sets,
               xor_keyindex_t *Q,size_t *Qsize)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  xor_keyindex_t ki;
  size_t i;
  size_t offset;
  size_t qsize;
  size_t addr;
  uint32_t slot;
  size_t *Qsize_local;
  xor_keyindex_t *Q_local;
  xor_xorset_t *sets_local;
  xor_setbuffer_t *buffer_local;
  uint64_t hash_local;
  uint32_t index_local;
  
  uVar2 = index >> ((byte)buffer->insignificantbits & 0x1f);
  uVar3 = buffer->counts[uVar2] + (uVar2 << ((byte)buffer->insignificantbits & 0x1f));
  buffer->buffer[uVar3].index = index;
  buffer->buffer[uVar3].hash = hash;
  buffer->counts[uVar2] = buffer->counts[uVar2] + 1;
  if (buffer->counts[uVar2] == buffer->slotsize) {
    qsize = *Qsize;
    uVar4 = (ulong)(uVar2 << ((byte)buffer->insignificantbits & 0x1f));
    for (i = uVar4; i < buffer->counts[uVar2] + uVar4; i = i + 1) {
      uVar1 = *(ulong *)&buffer->buffer[i].index;
      sets[uVar1 & 0xffffffff].xormask = buffer->buffer[i].hash ^ sets[uVar1 & 0xffffffff].xormask;
      sets[uVar1 & 0xffffffff].count = sets[uVar1 & 0xffffffff].count - 1;
      if (sets[uVar1 & 0xffffffff].count == 1) {
        Q[qsize].hash = sets[uVar1 & 0xffffffff].xormask;
        *(ulong *)&Q[qsize].index = uVar1;
        qsize = qsize + 1;
      }
    }
    *Qsize = qsize;
    buffer->counts[uVar2] = 0;
  }
  return;
}

Assistant:

static inline void xor_buffered_decrement_counter(uint32_t index, uint64_t hash,
                                                  xor_setbuffer_t *buffer,
                                                  xor_xorset_t *sets,
                                                  xor_keyindex_t *Q,
                                                  size_t *Qsize) {
  uint32_t slot = index >> (uint32_t)buffer->insignificantbits;
  size_t addr = buffer->counts[slot] + (slot << (uint32_t)buffer->insignificantbits);
  buffer->buffer[addr].index = index;
  buffer->buffer[addr].hash = hash;
  buffer->counts[slot]++;
  if (buffer->counts[slot] == buffer->slotsize) {
    size_t qsize = *Qsize;
    size_t offset = (slot << (uint32_t)buffer->insignificantbits);
    for (size_t i = offset; i < buffer->counts[slot] + offset; i++) {
      xor_keyindex_t ki =
          buffer->buffer[i];
      sets[ki.index].xormask ^= ki.hash;
      sets[ki.index].count--;
      if (sets[ki.index].count == 1) {
        ki.hash = sets[ki.index].xormask;
        Q[qsize] = ki;
        qsize += 1;
      }
    }
    *Qsize = qsize;
    buffer->counts[slot] = 0;
  }
}